

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O3

void rotate(float *a,float r,float ux,float uy,float uz)

{
  float fVar1;
  float c;
  float s;
  float local_90;
  float local_8c;
  float local_88;
  float local_78;
  float local_68;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined4 local_3c;
  undefined8 local_38;
  float local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  local_88 = ux;
  local_78 = uy;
  local_68 = uz;
  sincosf((r * 3.1415927) / 180.0,&local_8c,&local_90);
  fVar1 = 1.0 - local_90;
  local_30 = local_68 * local_68 * fVar1 + local_90;
  local_58 = CONCAT44(local_78 * local_88 * fVar1 + local_8c * local_68,
                      local_88 * local_88 * fVar1 + local_90);
  local_50 = local_68 * local_88 * fVar1 - local_8c * local_78;
  local_4c = 0;
  local_48 = CONCAT44(local_78 * local_78 * fVar1 + local_90,
                      local_78 * local_88 * fVar1 + -local_8c * local_68);
  local_40 = local_68 * local_78 * fVar1 + local_8c * local_88;
  local_3c = 0;
  local_38 = CONCAT44(local_68 * local_78 * fVar1 + -local_8c * local_88,
                      local_68 * local_88 * fVar1 + local_8c * local_78);
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0x3f800000;
  multiply(a,(float *)&local_58);
  return;
}

Assistant:

static void rotate(float *a, float r, float ux, float uy, float uz)
{
  float s, c;

  sincosf(r * M_PI / 180, &s, &c);

  float m[16] = {
         ux * ux * (1 - c) + c, uy * ux * (1 - c) + uz * s, ux * uz * (1 - c) - uy * s, 0,
    ux * uy * (1 - c) - uz * s,      uy * uy * (1 - c) + c, uy * uz * (1 - c) + ux * s, 0,
    ux * uz * (1 - c) + uy * s, uy * uz * (1 - c) - ux * s,      uz * uz * (1 - c) + c, 0,
                             0,                          0,                          0, 1
  };

  multiply(a, m);
}